

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

bool __thiscall TypeOp::markExplicitUnsigned(TypeOp *this,PcodeOp *op,int4 slot)

{
  bool bVar1;
  type_metatype tVar2;
  int4 iVar3;
  Varnode *this_00;
  HighVariable *pHVar4;
  Datatype *pDVar5;
  Varnode *pVVar6;
  PcodeOp *this_01;
  PcodeOp *lone;
  Varnode *outvn;
  Varnode *firstvn;
  type_metatype meta;
  Datatype *dt;
  Varnode *vn;
  int4 slot_local;
  PcodeOp *op_local;
  TypeOp *this_local;
  
  if ((this->addlflags & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if ((slot == 1) && ((this->addlflags & 2) != 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = PcodeOp::getIn(op,slot);
    bVar1 = Varnode::isConstant(this_00);
    if (bVar1) {
      pHVar4 = Varnode::getHigh(this_00);
      pDVar5 = HighVariable::getType(pHVar4);
      tVar2 = Datatype::getMetatype(pDVar5);
      if ((tVar2 == TYPE_UINT) || (tVar2 == TYPE_UNKNOWN)) {
        bVar1 = Datatype::isCharPrint(pDVar5);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = Datatype::isEnumType(pDVar5);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            iVar3 = PcodeOp::numInput(op);
            if ((iVar3 == 2) && ((this->addlflags & 2) == 0)) {
              pVVar6 = PcodeOp::getIn(op,1 - slot);
              pHVar4 = Varnode::getHigh(pVVar6);
              pDVar5 = HighVariable::getType(pHVar4);
              tVar2 = Datatype::getMetatype(pDVar5);
              if ((tVar2 == TYPE_UINT) || (tVar2 == TYPE_UNKNOWN)) {
                return false;
              }
            }
            pVVar6 = PcodeOp::getOut(op);
            if (pVVar6 != (Varnode *)0x0) {
              bVar1 = Varnode::isExplicit(pVVar6);
              if (bVar1) {
                return false;
              }
              this_01 = Varnode::loneDescend(pVVar6);
              if ((this_01 != (PcodeOp *)0x0) && (bVar1 = PcodeOp::inheritsSign(this_01), !bVar1)) {
                return false;
              }
            }
            Varnode::setUnsignedPrint(this_00);
            this_local._7_1_ = true;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TypeOp::markExplicitUnsigned(PcodeOp *op,int4 slot) const

{
  if ((addlflags & inherits_sign)==0) return false;
  if ((slot==1) && ((addlflags & inherits_sign_zero)!=0)) return false;
  Varnode *vn = op->getIn(slot);
  if (!vn->isConstant()) return false;
  Datatype *dt = vn->getHigh()->getType();
  type_metatype meta = dt->getMetatype();
  if ((meta != TYPE_UINT)&&(meta != TYPE_UNKNOWN)) return false;
  if (dt->isCharPrint()) return false;
  if (dt->isEnumType()) return false;
  if ((op->numInput() == 2) && ((addlflags & inherits_sign_zero)==0)) {
    Varnode *firstvn = op->getIn(1-slot);
    meta = firstvn->getHigh()->getType()->getMetatype();
    if ((meta == TYPE_UINT)||(meta == TYPE_UNKNOWN))
      return false;		// Other side of the operation will force the unsigned
  }
  // Check if type is going to get forced anyway
  Varnode *outvn = op->getOut();
  if (outvn != (Varnode *)0) {
    if (outvn->isExplicit()) return false;
    PcodeOp *lone = outvn->loneDescend();
    if (lone != (PcodeOp *)0) {
      if (!lone->inheritsSign()) return false;
    }
  }

  vn->setUnsignedPrint();
  return true;
}